

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall vmips::Binary::output(Binary *this,ostream *out)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  element_type *peVar3;
  ostream *out_local;
  Binary *this_local;
  
  iVar1 = (*(this->super_Instruction)._vptr_Instruction[1])();
  poVar2 = std::operator<<(out,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2," ");
  peVar3 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->lhs);
  poVar2 = operator<<(poVar2,peVar3);
  poVar2 = std::operator<<(poVar2,", ");
  peVar3 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->rhs);
  operator<<(poVar2,peVar3);
  return;
}

Assistant:

void Binary::output(std::ostream &out) const {
    out << name() << " " << *lhs << ", " << *rhs;
}